

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_publish(fio_publish_args_s args)

{
  uintptr_t *puVar1;
  fio_str_info_s ch;
  fio_str_info_s ch_00;
  fio_str_info_s ch_01;
  fio_str_info_s ch_02;
  fio_str_info_s data;
  fio_str_info_s data_00;
  fio_str_info_s data_01;
  fio_str_info_s data_02;
  size_t sVar2;
  fio_pubsub_engine_s *pfVar3;
  size_t sVar4;
  fio_pubsub_engine_s *pfVar5;
  fio_msg_internal_s *pfVar6;
  int8_t cpy;
  int8_t is_json;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  
  pfVar3 = (fio_pubsub_engine_s *)&DAT_00000001;
  if ((args.engine == (fio_pubsub_engine_s *)0x0 && args.filter != 0) ||
     (pfVar5 = args.engine, pfVar3 = FIO_PUBSUB_DEFAULT, args.engine == (fio_pubsub_engine_s *)0x0))
  {
    pfVar5 = pfVar3;
  }
  cpy = (int8_t)args.channel.data;
  is_json = (int8_t)args.channel.len;
  switch(pfVar5) {
  case (fio_pubsub_engine_s *)0x0:
  case (fio_pubsub_engine_s *)0x1:
    ch.len = 1;
    ch.capa = (ulong)(uint)(int)(char)args.is_json;
    ch.data._0_4_ = in_stack_ffffffffffffff88;
    ch.data._4_4_ = in_stack_ffffffffffffff8c;
    data.len = in_stack_ffffffffffffff98;
    data.capa = in_stack_ffffffffffffff90;
    data.data = in_stack_ffffffffffffffa0;
    pfVar6 = fio_msg_internal_create
                       (args.filter,(uint)((int)(char)args.is_json != 0),ch,data,is_json,cpy);
    fio_send2cluster(pfVar6);
    break;
  case (fio_pubsub_engine_s *)0x2:
    ch_01.len = 1;
    ch_01.capa = (ulong)(uint)(int)(char)args.is_json;
    ch_01.data._0_4_ = in_stack_ffffffffffffff88;
    ch_01.data._4_4_ = in_stack_ffffffffffffff8c;
    data_01.len = in_stack_ffffffffffffff98;
    data_01.capa = in_stack_ffffffffffffff90;
    data_01.data = in_stack_ffffffffffffffa0;
    pfVar6 = fio_msg_internal_create(args.filter,0,ch_01,data_01,is_json,cpy);
    break;
  case (fio_pubsub_engine_s *)0x3:
    ch_02.len = 1;
    ch_02.capa = (ulong)(uint)(int)(char)args.is_json;
    ch_02.data._0_4_ = in_stack_ffffffffffffff88;
    ch_02.data._4_4_ = in_stack_ffffffffffffff8c;
    data_02.len = in_stack_ffffffffffffff98;
    data_02.capa = in_stack_ffffffffffffff90;
    data_02.data = in_stack_ffffffffffffffa0;
    pfVar6 = fio_msg_internal_create
                       (args.filter,(uint)((int)(char)args.is_json != 0),ch_02,data_02,is_json,cpy);
    fio_send2cluster(pfVar6);
    LOCK();
    puVar1 = &pfVar6->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if (*puVar1 != 0) {
      return;
    }
    sVar4 = pfVar6->meta_len;
    while (sVar2 = sVar4, sVar2 != 0) {
      pfVar6->meta_len = sVar2 - 1;
      sVar4 = sVar2 - 1;
      if (*(code **)(&pfVar6->filter + sVar2 * 6) != (code *)0x0) {
        (**(code **)(&pfVar6->filter + sVar2 * 6))
                  (&stack0xffffffffffffff88,(&pfVar6->meta_len)[sVar2 * 3]);
        sVar4 = pfVar6->meta_len;
      }
    }
    fio_free(pfVar6);
    return;
  case (fio_pubsub_engine_s *)0x4:
    ch_00.len = 1;
    ch_00.capa = (ulong)(uint)(int)(char)args.is_json;
    ch_00.data._0_4_ = in_stack_ffffffffffffff88;
    ch_00.data._4_4_ = in_stack_ffffffffffffff8c;
    data_00.len = in_stack_ffffffffffffff98;
    data_00.capa = in_stack_ffffffffffffff90;
    data_00.data = in_stack_ffffffffffffffa0;
    pfVar6 = fio_msg_internal_create
                       (args.filter,3 - ((int)(char)args.is_json == 0),ch_00,data_00,is_json,cpy);
    if ((fio_data->is_worker != '\0') && (fio_data->workers != 1)) {
      fio_cluster_client_sender(pfVar6,-1);
      return;
    }
    break;
  default:
    if (args.filter == 0) {
      (*pfVar5->publish)(pfVar5,args.channel,args.message,args.is_json);
    }
    else if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "ERROR: (pub/sub) pub/sub engines can only be used for pub/sub messages (no filter)."
                    );
      return;
    }
    return;
  }
  fio_publish2process(pfVar6);
  return;
}

Assistant:

void fio_publish FIO_IGNORE_MACRO(fio_publish_args_s args) {
  if (args.filter && !args.engine) {
    args.engine = FIO_PUBSUB_CLUSTER;
  } else if (!args.engine) {
    args.engine = FIO_PUBSUB_DEFAULT;
  }
  fio_msg_internal_s *m = NULL;
  switch ((uintptr_t)args.engine) {
  case 0UL: /* fallthrough (missing default) */
  case 1UL: // ((uintptr_t)FIO_PUBSUB_CLUSTER):
    m = fio_msg_internal_create(
        args.filter,
        (args.is_json ? FIO_CLUSTER_MSG_JSON : FIO_CLUSTER_MSG_FORWARD),
        args.channel, args.message, args.is_json, 1);
    fio_send2cluster(m);
    fio_publish2process(m);
    break;
  case 2UL: // ((uintptr_t)FIO_PUBSUB_PROCESS):
    m = fio_msg_internal_create(args.filter, 0, args.channel, args.message,
                                args.is_json, 1);
    fio_publish2process(m);
    break;
  case 3UL: // ((uintptr_t)FIO_PUBSUB_SIBLINGS):
    m = fio_msg_internal_create(
        args.filter,
        (args.is_json ? FIO_CLUSTER_MSG_JSON : FIO_CLUSTER_MSG_FORWARD),
        args.channel, args.message, args.is_json, 1);
    fio_send2cluster(m);
    fio_msg_internal_free(m);
    m = NULL;
    break;
  case 4UL: // ((uintptr_t)FIO_PUBSUB_ROOT):
    m = fio_msg_internal_create(
        args.filter,
        (args.is_json ? FIO_CLUSTER_MSG_ROOT_JSON : FIO_CLUSTER_MSG_ROOT),
        args.channel, args.message, args.is_json, 1);
    if (fio_data->is_worker == 0 || fio_data->workers == 1) {
      fio_publish2process(m);
    } else {
      fio_cluster_client_sender(m, -1);
    }
    break;
  default:
    if (args.filter != 0) {
      FIO_LOG_ERROR("(pub/sub) pub/sub engines can only be used for "
                    "pub/sub messages (no filter).");
      return;
    }
    args.engine->publish(args.engine, args.channel, args.message, args.is_json);
  }
  return;
}